

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall spdlog::logger::set_level(logger *this,level_enum log_level)

{
  level_enum log_level_local;
  logger *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->_level).super___atomic_base<int>._M_i = log_level;
  UNLOCK();
  return;
}

Assistant:

inline void spdlog::logger::set_level(spdlog::level::level_enum log_level)
{
    _level.store(log_level);
}